

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImplicitTrapezoidal.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::integrators::ImplicitTrapezoidal::
evaluateCollocationConstraintSecondDerivatives
          (ImplicitTrapezoidal *this,double time,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
          *collocationPoints,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *controlInputs,
          double dT,VectorDynSize *lambda,CollocationHessianMap *stateSecondDerivative,
          CollocationHessianMap *controlSecondDerivative,
          CollocationHessianMap *stateControlSecondDerivative)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  size_type sVar4;
  ostream *poVar5;
  char *pcVar6;
  element_type *peVar7;
  const_reference pvVar8;
  mapped_type *pmVar9;
  element_type *peVar10;
  MatrixDynSize *pMVar11;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *in_RDX;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar12;
  map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
  *this_00;
  double in_XMM1_Qa;
  ostringstream errorMsg_1;
  ostringstream errorMsg;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffa08;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffffa10;
  VectorDynSize *in_stack_fffffffffffffa28;
  key_type *in_stack_fffffffffffffa48;
  StorageBaseType *in_stack_fffffffffffffa50;
  double *in_stack_fffffffffffffa58;
  CollocationHessianIndex local_4a0;
  CollocationHessianIndex local_490;
  CollocationHessianIndex local_480;
  CollocationHessianIndex local_470;
  CollocationHessianIndex local_460;
  CollocationHessianIndex local_450;
  CollocationHessianIndex local_440;
  CollocationHessianIndex local_430;
  CollocationHessianIndex local_420;
  CollocationHessianIndex local_410 [4];
  double local_3d0;
  string local_388 [32];
  ostringstream local_368 [376];
  string local_1f0 [48];
  ostringstream local_1c0 [400];
  double local_30;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *local_28;
  vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *local_20;
  double local_18;
  byte local_1;
  
  local_30 = in_XMM1_Qa;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_XMM0_Qa;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x10));
  if (bVar1) {
    sVar4 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::size
                      (local_20);
    if (sVar4 == 2) {
      sVar4 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::size
                        (local_28);
      if (sVar4 == 2) {
        peVar7 = std::
                 __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x38f823);
        pvVar8 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::
                 operator[](local_28,0);
        uVar2 = (*peVar7->_vptr_DynamicalSystem[3])(peVar7,pvVar8);
        if ((uVar2 & 1) == 0) {
          IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x38f862);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          iDynTree::reportError
                    (pcVar3,"evaluateCollocationConstraintSecondDerivatives",
                     "Error while setting the control input.");
          local_1 = 0;
        }
        else {
          local_3d0 = local_30 * 0.5;
          toEigen(in_stack_fffffffffffffa28);
          Eigen::operator*(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
          toEigen(in_stack_fffffffffffffa28);
          Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
                    (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
          peVar7 = std::
                   __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x38f91b);
          dVar12 = local_18;
          pvVar8 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::
                   operator[](local_20,0);
          uVar2 = (*peVar7->_vptr_DynamicalSystem[0xd])
                            (dVar12,peVar7,pvVar8,in_RDI + 0x200,in_RDI + 0x188);
          if ((uVar2 & 1) == 0) {
            IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x38f98e);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            iDynTree::reportError
                      (pcVar3,"evaluateCollocationConstraintSecondDerivatives",
                       "Error while evaluating the dynamical system state second derivative.");
            local_1 = 0;
          }
          else {
            CollocationHessianIndex::CollocationHessianIndex(local_410,0,0);
            pmVar9 = std::
                     map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                     ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                                   *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
            iDynTree::MatrixDynSize::operator=(pmVar9,(MatrixDynSize *)(in_RDI + 0x188));
            CollocationHessianIndex::CollocationHessianIndex(&local_420,0,1);
            pmVar9 = std::
                     map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                     ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                                   *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
            iDynTree::MatrixDynSize::operator=(pmVar9,(MatrixDynSize *)(in_RDI + 0x110));
            peVar7 = std::
                     __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x38fa8a);
            dVar12 = local_18;
            pvVar8 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                     ::operator[](local_20,0);
            uVar2 = (*peVar7->_vptr_DynamicalSystem[0xe])
                              (dVar12,peVar7,pvVar8,in_RDI + 0x200,in_RDI + 0x1b0);
            if ((uVar2 & 1) == 0) {
              IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x38fafd);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              iDynTree::reportError
                        (pcVar3,"evaluateCollocationConstraintSecondDerivatives",
                         "Error while evaluating the dynamical system control second derivative.");
              local_1 = 0;
            }
            else {
              CollocationHessianIndex::CollocationHessianIndex(&local_430,0,0);
              pmVar9 = std::
                       map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                       ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                                     *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
              iDynTree::MatrixDynSize::operator=(pmVar9,(MatrixDynSize *)(in_RDI + 0x1b0));
              CollocationHessianIndex::CollocationHessianIndex(&local_440,0,1);
              pmVar9 = std::
                       map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                       ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                                     *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
              iDynTree::MatrixDynSize::operator=(pmVar9,(MatrixDynSize *)(in_RDI + 0x138));
              peVar7 = std::
                       __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x38fbf9);
              dVar12 = local_18;
              pvVar8 = std::
                       vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::
                       operator[](local_20,0);
              uVar2 = (*peVar7->_vptr_DynamicalSystem[0xf])
                                (dVar12,peVar7,pvVar8,in_RDI + 0x200,in_RDI + 0x1d8);
              if ((uVar2 & 1) == 0) {
                IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x38fc6c);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                iDynTree::reportError
                          (pcVar3,"evaluateCollocationConstraintSecondDerivatives",
                           "Error while evaluating the dynamical system second derivative wrt state and control."
                          );
                local_1 = 0;
              }
              else {
                CollocationHessianIndex::CollocationHessianIndex(&local_450,0,0);
                pmVar9 = std::
                         map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                         ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                                       *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
                iDynTree::MatrixDynSize::operator=(pmVar9,(MatrixDynSize *)(in_RDI + 0x1d8));
                CollocationHessianIndex::CollocationHessianIndex(&local_460,0,1);
                pmVar9 = std::
                         map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                         ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                                       *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
                iDynTree::MatrixDynSize::operator=(pmVar9,(MatrixDynSize *)(in_RDI + 0x160));
                CollocationHessianIndex::CollocationHessianIndex(&local_470,1,0);
                pmVar9 = std::
                         map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                         ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                                       *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
                iDynTree::MatrixDynSize::operator=(pmVar9,(MatrixDynSize *)(in_RDI + 0x160));
                peVar7 = std::
                         __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x38fdb1);
                pvVar8 = std::
                         vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::
                         operator[](local_28,1);
                uVar2 = (*peVar7->_vptr_DynamicalSystem[3])(peVar7,pvVar8);
                if ((uVar2 & 1) == 0) {
                  IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x38fdf1);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  iDynTree::reportError
                            (pcVar3,"evaluateCollocationConstraintSecondDerivatives",
                             "Error while setting the control input.");
                  local_1 = 0;
                }
                else {
                  peVar7 = std::
                           __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x38fe2d);
                  dVar12 = local_18 + local_30;
                  pvVar8 = std::
                           vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                           ::operator[](local_20,1);
                  uVar2 = (*peVar7->_vptr_DynamicalSystem[0xd])
                                    (dVar12,peVar7,pvVar8,in_RDI + 0x200,in_RDI + 0x188);
                  if ((uVar2 & 1) == 0) {
                    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x38fe9e);
                    pcVar3 = (char *)std::__cxx11::string::c_str();
                    iDynTree::reportError
                              (pcVar3,"evaluateCollocationConstraintSecondDerivatives",
                               "Error while evaluating the dynamical system state second derivative."
                              );
                    local_1 = 0;
                  }
                  else {
                    CollocationHessianIndex::CollocationHessianIndex(&local_480,1,1);
                    pmVar9 = std::
                             map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                             ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                                           *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
                    iDynTree::MatrixDynSize::operator=(pmVar9,(MatrixDynSize *)(in_RDI + 0x188));
                    peVar7 = std::
                             __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)0x38ff2e);
                    this_00 = (map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                               *)(local_18 + local_30);
                    pvVar8 = std::
                             vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                             ::operator[](local_20,1);
                    uVar2 = (*peVar7->_vptr_DynamicalSystem[0xe])
                                      (this_00,peVar7,pvVar8,in_RDI + 0x200,in_RDI + 0x1b0);
                    if ((uVar2 & 1) == 0) {
                      IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x38ff9f);
                      pcVar3 = (char *)std::__cxx11::string::c_str();
                      iDynTree::reportError
                                (pcVar3,"evaluateCollocationConstraintSecondDerivatives",
                                 "Error while evaluating the dynamical system control second derivative."
                                );
                      local_1 = 0;
                    }
                    else {
                      CollocationHessianIndex::CollocationHessianIndex(&local_490,1,1);
                      pmVar9 = std::
                               map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                               ::operator[](this_00,(key_type *)peVar7);
                      iDynTree::MatrixDynSize::operator=(pmVar9,(MatrixDynSize *)(in_RDI + 0x1b0));
                      peVar10 = std::
                                __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)0x39002f);
                      pvVar8 = std::
                               vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                               ::operator[](local_20,1);
                      uVar2 = (*peVar10->_vptr_DynamicalSystem[0xf])
                                        (local_18 + local_30,peVar10,pvVar8,in_RDI + 0x200,
                                         in_RDI + 0x1d8);
                      if ((uVar2 & 1) == 0) {
                        IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x3900a0);
                        pcVar3 = (char *)std::__cxx11::string::c_str();
                        iDynTree::reportError
                                  (pcVar3,"evaluateCollocationConstraintSecondDerivatives",
                                   "Error while evaluating the dynamical system second derivative wrt state and control."
                                  );
                        local_1 = 0;
                      }
                      else {
                        pMVar11 = (MatrixDynSize *)(in_RDI + 0x1d8);
                        CollocationHessianIndex::CollocationHessianIndex(&local_4a0,1,1);
                        pmVar9 = std::
                                 map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                                 ::operator[](this_00,(key_type *)peVar7);
                        iDynTree::MatrixDynSize::operator=(pmVar9,pMVar11);
                        local_1 = 1;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_368);
        std::operator<<((ostream *)local_368,
                        "The size of the matrix containing the control inputs does not match the expected one. Input = "
                       );
        sVar4 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::size
                          (local_28);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_368,sVar4);
        std::operator<<(poVar5,", Expected = 2.");
        IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x38f746);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError(pcVar3,"evaluateCollocationConstraintSecondDerivatives",pcVar6);
        std::__cxx11::string::~string(local_388);
        local_1 = 0;
        std::__cxx11::ostringstream::~ostringstream(local_368);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1c0);
      std::operator<<((ostream *)local_1c0,
                      "The size of the matrix containing the collocation point does not match the expected one. Input = "
                     );
      sVar4 = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::size
                        (local_20);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,sVar4);
      std::operator<<(poVar5,", Expected = 2.");
      IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x38f5ea);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError(pcVar3,"evaluateCollocationConstraintSecondDerivatives",pcVar6);
      std::__cxx11::string::~string(local_1f0);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1c0);
    }
  }
  else {
    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x38f52f);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError
              (pcVar3,"evaluateCollocationConstraintSecondDerivatives","Dynamical system not set.");
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ImplicitTrapezoidal::evaluateCollocationConstraintSecondDerivatives(double time, const std::vector<VectorDynSize> &collocationPoints,
                                                                                     const std::vector<VectorDynSize> &controlInputs, double dT, const VectorDynSize &lambda,
                                                                                     iDynTree::optimalcontrol::integrators::CollocationHessianMap &stateSecondDerivative,
                                                                                     iDynTree::optimalcontrol::integrators::CollocationHessianMap &controlSecondDerivative,
                                                                                     iDynTree::optimalcontrol::integrators::CollocationHessianMap &stateControlSecondDerivative)
            {
                if (!m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", "Dynamical system not set.");
                    return false;
                }

                if (collocationPoints.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the collocation point does not match the expected one. Input = ";
                    errorMsg << collocationPoints.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", errorMsg.str().c_str());
                    return false;
                }

                if (controlInputs.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the control inputs does not match the expected one. Input = ";
                    errorMsg << controlInputs.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", errorMsg.str().c_str());
                    return false;
                }

                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[0])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", "Error while setting the control input.");
                    return false;
                }

                toEigen(m_lambda) = 0.5 * dT * toEigen(lambda);

                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTState(time, collocationPoints[0], m_lambda, m_stateHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system state second derivative.");
                    return false;
                }

                stateSecondDerivative[CollocationHessianIndex(0, 0)] = m_stateHessianBuffer;

                stateSecondDerivative[CollocationHessianIndex(0, 1)] = m_zeroNxNxBuffer;

                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTControl(time, collocationPoints[0], m_lambda, m_controlHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system control second derivative.");
                    return false;
                }

                controlSecondDerivative[CollocationHessianIndex(0, 0)] = m_controlHessianBuffer;

                controlSecondDerivative[CollocationHessianIndex(0, 1)] = m_zeroNuNuBuffer;

                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTStateControl(time, collocationPoints[0], m_lambda, m_mixedHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system second derivative wrt state and control.");
                    return false;
                }

                stateControlSecondDerivative[CollocationHessianIndex(0, 0)] = m_mixedHessianBuffer;

                stateControlSecondDerivative[CollocationHessianIndex(0, 1)] = m_zeroNxNuBuffer;

                stateControlSecondDerivative[CollocationHessianIndex(1, 0)] = m_zeroNxNuBuffer;


                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[1])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", "Error while setting the control input.");
                    return false;
                }

                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTState(time + dT, collocationPoints[1], m_lambda, m_stateHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system state second derivative.");
                    return false;
                }

                stateSecondDerivative[CollocationHessianIndex(1, 1)] = m_stateHessianBuffer;


                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTControl(time + dT, collocationPoints[1], m_lambda, m_controlHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system control second derivative.");
                    return false;
                }

                controlSecondDerivative[CollocationHessianIndex(1, 1)] = m_controlHessianBuffer;


                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTStateControl(time + dT, collocationPoints[1], m_lambda, m_mixedHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system second derivative wrt state and control.");
                    return false;
                }

                stateControlSecondDerivative[CollocationHessianIndex(1, 1)] = m_mixedHessianBuffer;

                return true;
            }